

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::createPrimRefArray_presplit<embree::TriangleMesh,embree::avx::TriangleSplitterFactory>
          (PrimInfo *__return_storage_ptr__,avx *this,Geometry *geometry,uint geomID,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  uint uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  PrimInfo *pPVar4;
  char cVar5;
  int iVar6;
  unsigned_long uVar7;
  long lVar8;
  runtime_error *prVar9;
  undefined4 in_register_0000000c;
  size_t *psVar10;
  ulong uVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined1 auVar13 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [64];
  size_t taskCount;
  PrimInfo *pinfo;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  auto_partitioner local_2949;
  unsigned_long local_2948;
  uint local_293c;
  Geometry *local_2938;
  ulong local_2930 [2];
  mvector<PrimRef> *local_2920;
  mvector<PrimRef> *local_2918;
  long local_2910;
  PrimInfo *local_2908;
  anon_class_8_1_898bcfc2_conflict4 local_2900;
  anon_class_24_3_3a534e91 local_28f8;
  anon_class_40_5_11684cf9 local_28e0;
  task_group_context local_28b8;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> local_2838;
  
  local_2910 = CONCAT44(in_register_0000000c,geomID);
  local_293c = (uint)geometry;
  local_2938 = (Geometry *)this;
  local_2920 = prims;
  local_2908 = __return_storage_ptr__;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  uVar1 = *(uint *)(this + 0x20);
  local_2930[1] = 0;
  local_2930[0] = (ulong)uVar1;
  local_2918 = (mvector<PrimRef> *)numPrimRefs;
  local_28f8.geometry = &local_2938;
  local_28f8.prims = (mvector<PrimRef> *)numPrimRefs;
  local_28f8.geomID = &local_293c;
  iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar11 = (ulong)uVar1 + 0x3ff >> 10;
  if ((ulong)(long)iVar6 < uVar11) {
    uVar11 = (long)iVar6;
  }
  uVar7 = 0x40;
  if (uVar11 < 0x40) {
    uVar7 = uVar11;
  }
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2948 = uVar7;
  local_28e0.first = local_2930 + 1;
  local_28e0.last = local_2930;
  local_28e0.taskCount = &local_2948;
  local_28e0.state = &local_2838;
  local_28e0.func = &local_28f8;
  tbb::detail::r1::initialize(&local_28b8);
  local_2900.func = &local_28e0;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar7,1,&local_2900,&local_2949,&local_28b8);
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  pPVar4 = local_2908;
  if (cVar5 != '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"task cancelled");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  auVar19 = ZEXT1664((undefined1  [16])0x0);
  pPVar4->begin = 0;
  pPVar4->end = 0;
  if (local_2948 == 0) {
    aVar12.m128[2] = INFINITY;
    aVar12._0_8_ = 0x7f8000007f800000;
    aVar12.m128[3] = INFINITY;
    aVar14.m128[2] = -INFINITY;
    aVar14._0_8_ = 0xff800000ff800000;
    aVar14.m128[3] = -INFINITY;
    lVar8 = 0;
    aVar16 = aVar12;
    aVar17 = aVar14;
  }
  else {
    aVar14.m128[2] = -INFINITY;
    aVar14._0_8_ = 0xff800000ff800000;
    aVar14.m128[3] = -INFINITY;
    aVar12.m128[2] = INFINITY;
    aVar12._0_8_ = 0x7f8000007f800000;
    aVar12.m128[3] = INFINITY;
    psVar10 = &local_2838.sums[0].begin;
    uVar7 = local_2948;
    aVar17 = aVar14;
    aVar16 = aVar12;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -8) = aVar16;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -6) = aVar14;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -4) = aVar12;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -2) = aVar17;
      sVar3 = pPVar4->end;
      *psVar10 = pPVar4->begin;
      psVar10[1] = sVar3;
      aVar16.m128 = (__m128)vminps_avx(aVar16.m128,*(undefined1 (*) [16])(psVar10 + -0x288));
      aVar14.m128 = (__m128)vmaxps_avx(aVar14.m128,*(undefined1 (*) [16])(psVar10 + -0x286));
      aVar12.m128 = (__m128)vminps_avx(aVar12.m128,*(undefined1 (*) [16])(psVar10 + -0x284));
      aVar17.m128 = (__m128)vmaxps_avx(aVar17.m128,*(undefined1 (*) [16])(psVar10 + -0x282));
      auVar13 = vpaddq_avx(auVar19._0_16_,*(undefined1 (*) [16])(psVar10 + -0x280));
      auVar19 = ZEXT1664(auVar13);
      pPVar4->begin = auVar13._0_8_;
      pPVar4->end = auVar13._8_8_;
      psVar10 = psVar10 + 10;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    auVar2 = vpshufd_avx(auVar13,0xee);
    auVar13 = vpsubq_avx(auVar2,auVar13);
    lVar8 = auVar13._0_8_;
  }
  (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar16;
  (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar14;
  (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar12;
  (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar17;
  if (lVar8 != local_2910) {
    (*(code *)((local_2920->alloc).device)->_vptr_MemoryMonitorInterface)(local_2920,0);
    uVar1 = local_2938->numPrimitives;
    local_28f8.geometry = &local_2938;
    local_28f8.prims = local_2918;
    local_28f8.geomID = &local_293c;
    local_2930[1] = 0;
    local_2930[0] = (ulong)uVar1;
    iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar11 = (ulong)uVar1 + 0x3ff >> 10;
    if ((ulong)(long)iVar6 < uVar11) {
      uVar11 = (long)iVar6;
    }
    uVar7 = 0x40;
    if (uVar11 < 0x40) {
      uVar7 = uVar11;
    }
    local_28e0.first = local_2930 + 1;
    local_28e0.last = local_2930;
    local_28e0.func = &local_28f8;
    local_28b8.my_version = proxy_support;
    local_28b8.my_traits = (context_traits)0x4;
    local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_28b8.my_name = CUSTOM_CTX;
    local_2948 = uVar7;
    local_28e0.taskCount = &local_2948;
    local_28e0.state = &local_2838;
    tbb::detail::r1::initialize(&local_28b8);
    local_2900.func = &local_28e0;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar7,1,&local_2900,&local_2949,&local_28b8);
    cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
    if (cVar5 != '\0') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"task cancelled");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_28b8);
    auVar13 = ZEXT816(0) << 0x40;
    if (local_2948 == 0) {
      aVar17.m128[2] = -INFINITY;
      aVar17._0_8_ = 0xff800000ff800000;
      aVar17.m128[3] = -INFINITY;
      aVar18.m128[2] = INFINITY;
      aVar18._0_8_ = 0x7f8000007f800000;
      aVar18.m128[3] = INFINITY;
      aVar15 = aVar18;
      aVar16 = aVar17;
    }
    else {
      aVar15.m128[2] = INFINITY;
      aVar15._0_8_ = 0x7f8000007f800000;
      aVar15.m128[3] = INFINITY;
      aVar16.m128[2] = -INFINITY;
      aVar16._0_8_ = 0xff800000ff800000;
      aVar16.m128[3] = -INFINITY;
      psVar10 = &local_2838.sums[0].begin;
      aVar17 = aVar16;
      aVar18 = aVar15;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -8) = aVar18;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -6) = aVar17;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -4) = aVar15;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -2) = aVar16;
        *(undefined1 (*) [16])psVar10 = auVar13;
        aVar18.m128 = (__m128)vminps_avx(aVar18.m128,*(undefined1 (*) [16])(psVar10 + -0x288));
        aVar17.m128 = (__m128)vmaxps_avx(aVar17.m128,*(undefined1 (*) [16])(psVar10 + -0x286));
        aVar15.m128 = (__m128)vminps_avx(aVar15.m128,*(undefined1 (*) [16])(psVar10 + -0x284));
        aVar16.m128 = (__m128)vmaxps_avx(aVar16.m128,*(undefined1 (*) [16])(psVar10 + -0x282));
        auVar13 = vpaddq_avx(auVar13,*(undefined1 (*) [16])(psVar10 + -0x280));
        psVar10 = psVar10 + 10;
        local_2948 = local_2948 - 1;
      } while (local_2948 != 0);
    }
    (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar18;
    (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar17;
    (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar15;
    (pPVar4->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar16;
    pPVar4->begin = auVar13._0_8_;
    pPVar4->end = auVar13._8_8_;
  }
  return pPVar4;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Geometry* geometry, unsigned int geomID, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	  return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	      return geometry->createPrimRefArray(prims,r,base.size(),geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}
      return pinfo;	
    }